

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

regexp_flag __thiscall mjs::regexp_flags_from_string(mjs *this,wstring_view s)

{
  uint uVar1;
  regexp_flag rVar2;
  ostream *poVar3;
  runtime_error *this_00;
  long lVar4;
  char *pcVar5;
  regexp_flag rVar6;
  string local_1b0 [32];
  ostringstream oss;
  
  lVar4 = 0;
  pcVar5 = "Invalid";
  rVar2 = none;
  while( true ) {
    if ((long)this * 4 == lVar4) {
      return rVar2;
    }
    uVar1 = *(uint *)(s._M_len + lVar4);
    rVar6 = global;
    if ((char)uVar1 != 'g') {
      if ((uVar1 & 0xff) == 0x6d) {
        rVar6 = multiline;
      }
      else {
        if ((uVar1 & 0xff) != 0x69) goto LAB_001674df;
        rVar6 = ignore_case;
      }
    }
    if ((rVar6 & rVar2) != none) break;
    rVar2 = rVar2 | rVar6;
    lVar4 = lVar4 + 4;
  }
  pcVar5 = "Duplicate";
LAB_001674df:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  if ((uVar1 & 0xff80) == 0) {
    poVar3 = std::operator<<((ostream *)&oss,pcVar5);
    poVar3 = std::operator<<(poVar3," flag \'");
    poVar3 = std::operator<<(poVar3,(char)uVar1);
    std::operator<<(poVar3,"\' given to RegExp constructor");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,local_1b0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __assert_fail("static_cast<char16_t>(ch) <= 0x7f",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp.cpp",
                0x28,"regexp_flag mjs::regexp_flags_from_string(std::wstring_view)");
}

Assistant:

regexp_flag regexp_flags_from_string(std::wstring_view s) {
    auto f = regexp_flag::none;
    for (const auto ch: s) {
        const regexp_flag here = regexp_flag_from_char(static_cast<char>(ch));
        if (here == regexp_flag::none || (f & here) != regexp_flag::none) {
            std::ostringstream oss;
            assert(static_cast<char16_t>(ch) <= 0x7f); // TODO: Report better...
            oss << (here == regexp_flag::none ? "Invalid" : "Duplicate") << " flag '" << static_cast<char>(ch) << "' given to RegExp constructor";
            throw std::runtime_error(oss.str());
        }
        f = f | here;
    }
    return f;
}